

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
VisitRelationalExpression<_1,std::initializer_list<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>>
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,initializer_list<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> ea)

{
  bool bVar1;
  AlgebraicExpression<mp::QuadAndLinTerms> *this_00;
  AlgConRhs<_1> in_RSI;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  double dVar2;
  value_type *lhs;
  array<mp::EExpr,_2UL> ee;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_stack_fffffffffffff298;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *in_stack_fffffffffffff2a0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *this_01;
  AlgebraicExpression<mp::QuadAndLinTerms> *ae;
  array<mp::EExpr,_2UL> *in_stack_fffffffffffff2b0;
  undefined1 fSort;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *this_02;
  AlgConRhs<_1> local_d20 [11];
  Arguments *in_stack_fffffffffffff338;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_fffffffffffff340;
  array<mp::EExpr,_2UL> *in_stack_fffffffffffff470;
  Arguments *in_stack_fffffffffffff478;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffff480;
  AlgConRhs<_1> local_768 [36];
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_648;
  AlgebraicExpression<mp::QuadAndLinTerms> *local_578;
  undefined1 local_570 [464];
  AlgebraicExpression<mp::QuadAndLinTerms> local_3a0 [2];
  
  this_02 = in_RDI;
  std::array<mp::EExpr,_2UL>::array(in_stack_fffffffffffff2b0);
  Exprs2EExprs<std::initializer_list<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,2ul>
            (in_stack_fffffffffffff480,
             (initializer_list<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)
             in_stack_fffffffffffff478,in_stack_fffffffffffff470);
  ae = local_3a0;
  this_00 = &std::array<mp::EExpr,_2UL>::operator[]
                       ((array<mp::EExpr,_2UL> *)in_stack_fffffffffffff2a0,
                        (size_type)in_stack_fffffffffffff298)->super_QuadraticExpr;
  std::array<mp::EExpr,_2UL>::operator[]
            ((array<mp::EExpr,_2UL> *)in_stack_fffffffffffff2a0,(size_type)in_stack_fffffffffffff298
            );
  fSort = (undefined1)((ulong)local_570 >> 0x38);
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
            ((AlgebraicExpression<mp::QuadAndLinTerms> *)in_stack_fffffffffffff2a0,
             in_stack_fffffffffffff298);
  AlgebraicExpression<mp::QuadAndLinTerms>::subtract(this_00,ae);
  AlgebraicExpression<mp::QuadAndLinTerms>::~AlgebraicExpression
            ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x658939);
  local_578 = &std::array<mp::EExpr,_2UL>::operator[]
                         ((array<mp::EExpr,_2UL> *)in_stack_fffffffffffff2a0,
                          (size_type)in_stack_fffffffffffff298)->super_QuadraticExpr;
  QuadAndLinTerms::sort_terms((QuadAndLinTerms *)in_stack_fffffffffffff2a0);
  bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::is_affine
                    ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x65896e);
  if (bVar1) {
    QuadAndLinTerms::GetLinTerms(&local_578->super_QuadAndLinTerms);
    LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffff2a0,(LinTerms *)in_stack_fffffffffffff298);
    dVar2 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(local_578);
    AlgConRhs<-1>::AlgConRhs(local_768,-dVar2);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)this_02,(LinTerms *)in_RDI,
               in_RSI,(bool)fSort);
    this_01 = &local_648;
    ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
    ConditionalConstraint(in_stack_fffffffffffff340,in_stack_fffffffffffff338);
    AssignResult2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
              (this_02,(ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                        *)in_RDI);
    ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
    ~ConditionalConstraint
              ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *)
               0x658a1d);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(this_01);
    LinTerms::~LinTerms((LinTerms *)this_01);
  }
  else {
    AlgebraicExpression<mp::QuadAndLinTerms>::GetAlgConBody
              ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x658ae9);
    QuadAndLinTerms::QuadAndLinTerms(&this_00->super_QuadAndLinTerms,&ae->super_QuadAndLinTerms);
    dVar2 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(local_578);
    AlgConRhs<-1>::AlgConRhs(local_d20,-dVar2);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *)this_02,
               (QuadAndLinTerms *)in_RDI,in_RSI,(bool)fSort);
    ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::
    ConditionalConstraint
              ((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                *)in_stack_fffffffffffff480,in_stack_fffffffffffff478);
    AssignResult2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>>
              (this_02,(ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                        *)in_RDI);
    ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::
    ~ConditionalConstraint
              ((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                *)0x658b76);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
              (in_stack_fffffffffffff2a0);
    QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_fffffffffffff2a0);
  }
  std::array<mp::EExpr,_2UL>::~array((array<mp::EExpr,_2UL> *)this_00);
  return (EExpr *)this_02;
}

Assistant:

EExpr VisitRelationalExpression(ExprArray ea) {
    std::array<EExpr, 2> ee;
    Exprs2EExprs(ea, ee);
    ee[0].subtract(std::move(ee[1]));
    auto& lhs = ee[0];
    lhs.sort_terms();                             // to catch duplicates
    if (lhs.is_affine())                          // no QP terms
      return AssignResult2Args(                   // add conditional linear constraint
            ConditionalConstraint< LinConRhs<comp_kind> >
            { { std::move(lhs.GetLinTerms()),
                -lhs.constant_term() } } );
    return AssignResult2Args(                     // add conditional quadratic constraint
            ConditionalConstraint< QuadConRhs<comp_kind> >
            { { std::move(lhs.GetAlgConBody()),
                -lhs.constant_term() } } );
  }